

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O3

int encoder_append_type(ndn_encoder_t *encoder,uint32_t type)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint8_t uVar6;
  
  uVar5 = encoder->offset;
  uVar3 = encoder->output_max_size - uVar5;
  iVar1 = 1;
  if (0xfc < type || encoder->output_max_size == uVar5) {
    if (type < 0x10000 && 2 < uVar3) {
      iVar1 = 3;
      iVar4 = 2;
      iVar2 = 1;
      uVar6 = 0xfd;
    }
    else {
      if (uVar3 < 5) {
        return -0xe;
      }
      encoder->output_value[uVar5] = 0xfe;
      encoder->output_value[encoder->offset + 1] = (uint8_t)(type >> 0x18);
      uVar6 = (uint8_t)(type >> 0x10);
      uVar5 = encoder->offset + 2;
      iVar1 = 5;
      iVar4 = 4;
      iVar2 = 3;
    }
    encoder->output_value[uVar5] = uVar6;
    encoder->output_value[iVar2 + encoder->offset] = (uint8_t)(type >> 8);
    uVar5 = iVar4 + encoder->offset;
  }
  encoder->output_value[uVar5] = (uint8_t)type;
  encoder->offset = encoder->offset + iVar1;
  return 0;
}

Assistant:

static inline int
encoder_append_type(ndn_encoder_t* encoder, uint32_t type)
{
  return encoder_append_var(encoder, type);
}